

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

int run_many_negation_range_tests_simpler(_Bool inplace)

{
  byte bVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  run_container_t *src;
  run_container_t *prVar7;
  int x;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000039;
  ulong uVar14;
  unsigned_long a;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint8_t type;
  ushort uVar21;
  bool bVar22;
  container_t *BO;
  _Bool result_should_be [65536];
  run_container_t *prStack_10078;
  undefined4 uStack_1006c;
  ulong uStack_10068;
  int iStack_10060;
  int iStack_1005c;
  uint uStack_10058;
  int iStack_10054;
  ulong uStack_10050;
  ulong uStack_10048;
  ulong uStack_10040;
  byte abStack_10038 [65544];
  
  uStack_1006c = (undefined4)CONCAT71(in_register_00000039,inplace);
  uVar10 = 1;
LAB_00109dc4:
  iVar5 = printf("h=%d\n",uVar10);
  if (0x62 < (uint)uVar10) {
    return iVar5;
  }
  uVar20 = (uint)uVar10 + 1;
  uStack_10068 = uVar10;
LAB_00109de6:
  uVar10 = uStack_10068;
  uVar14 = 0;
  printf("  k=%d\n",(ulong)uVar20);
  iStack_10060 = (int)(0x10000 / (long)(int)uVar20) + 1;
  uStack_10048 = (ulong)((int)uVar10 < (int)uVar20);
LAB_00109e17:
  uVar13 = (uint)uVar14;
  iStack_10054 = 0x10000 - uVar13;
  if (iStack_10054 < 2) {
    iStack_10054 = 1;
  }
  uStack_10058 = ~uVar13;
  iStack_1005c = uVar13 + 1;
  uVar10 = 0;
  uStack_10050 = uVar14;
LAB_00109e46:
  uVar14 = 0;
  iVar5 = (int)uVar10;
  uVar9 = uVar10 & 0xffffffff;
LAB_00109e4c:
  uStack_10040 = uVar14;
  src = run_container_create_given_capacity(iStack_10060);
  _assert_true(uStack_10048,"h < k",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x67d);
  uVar16 = uStack_10050 & 0xffffffff;
  iVar8 = 0;
  uVar14 = uStack_10068;
  iVar11 = iStack_1005c;
  uVar13 = uStack_10058;
  do {
    if (iVar8 % (int)uVar20 == 0) {
      uVar6 = (int)uVar14 + 1;
      iVar17 = (int)uVar14 + iVar11;
      if (0xffff < iVar17) {
        iVar17 = 0;
      }
      src->runs[src->n_runs] = (rle16_t)((uint)uVar16 & 0xffff | (iVar17 + uVar13) * 0x10000);
      src->n_runs = src->n_runs + 1;
      if (uVar6 == uVar20) {
        uVar6 = (uint)uStack_10068;
      }
      uVar14 = (ulong)uVar6;
    }
    iVar8 = iVar8 + 1;
    uVar16 = (ulong)((uint)uVar16 + 1);
    uVar13 = uVar13 - 1;
    iVar11 = iVar11 + 1;
  } while (iStack_10054 != iVar8);
  prVar3 = src->runs;
  iVar11 = src->n_runs;
  iVar8 = (int)uVar9;
  uVar14 = 0;
  iVar17 = 0;
  do {
    bVar22 = (long)uVar14 < (long)iVar8 && uVar10 <= uVar14;
    if (iVar11 < 1) {
LAB_00109f5d:
      if (bVar22) goto LAB_00109f53;
LAB_00109f62:
      abStack_10038[uVar14] = 0;
    }
    else {
      uVar9 = 0;
      iVar19 = iVar11 + -1;
      do {
        uVar13 = (uint)(iVar19 + (int)uVar9) >> 1;
        if (prVar3[uVar13].value < (ushort)uVar14) {
          uVar9 = (ulong)(uVar13 + 1);
        }
        else {
          if (prVar3[uVar13].value <= (ushort)uVar14) {
            if ((long)uVar14 < (long)iVar8 && uVar10 <= uVar14) goto LAB_00109f62;
            goto LAB_00109f53;
          }
          iVar19 = uVar13 - 1;
        }
      } while ((int)uVar9 <= iVar19);
      if ((int)uVar9 == 0) goto LAB_00109f5d;
      if (bVar22 != (int)(uint)prVar3[uVar9 - 1].length <
                    (int)((int)uVar14 - (uint)prVar3[uVar9 - 1].value)) goto LAB_00109f62;
LAB_00109f53:
      abStack_10038[uVar14] = 1;
      iVar17 = iVar17 + 1;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x10000);
  if ((char)uStack_1006c == '\0') {
    uVar13 = run_container_negation_range(src,iVar5,iVar8,&prStack_10078);
  }
  else {
    uVar13 = run_container_negation_range_inplace(src,iVar5,iVar8,&prStack_10078);
  }
  type = (uint8_t)uVar13;
  prVar7 = prStack_10078;
  uVar4 = type;
  if (type == '\x04') {
    prVar7 = *(run_container_t **)prStack_10078;
    uVar4 = *(uint8_t *)&prStack_10078->runs;
  }
  if (uVar4 == '\x03') {
    iVar11 = run_container_cardinality(prVar7);
  }
  else {
    iVar11 = prVar7->n_runs;
  }
  _assert_int_equal((long)iVar17,(long)iVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x6a1);
  uVar14 = 0;
LAB_00109fee:
  prVar7 = prStack_10078;
  uVar6 = uVar13;
  if (type == '\x04') {
    uVar6 = (uint)*(byte *)&prStack_10078->runs;
    prVar7 = *(run_container_t **)prStack_10078;
  }
  prVar3 = prVar7->runs;
  uVar21 = (ushort)uVar14;
  if ((char)uVar6 == '\x03') {
    if (0 < prVar7->n_runs) {
      iVar11 = prVar7->n_runs + -1;
      uVar9 = 0;
      do {
        uVar6 = (uint)(iVar11 + (int)uVar9) >> 1;
        if (prVar3[uVar6].value < uVar21) {
          uVar9 = (ulong)(uVar6 + 1);
        }
        else {
          if (prVar3[uVar6].value <= uVar21) goto LAB_0010a0e3;
          iVar11 = uVar6 - 1;
        }
      } while ((int)uVar9 <= iVar11);
      if (((int)uVar9 != 0) &&
         (bVar22 = true,
         (int)((int)uVar14 - (uint)prVar3[uVar9 - 1].value) <= (int)(uint)prVar3[uVar9 - 1].length))
      goto LAB_0010a0e6;
    }
LAB_0010a0df:
    bVar22 = false;
  }
  else if ((uVar6 & 0xff) == 2) {
    uVar9 = 0;
    uVar6 = prVar7->n_runs;
    do {
      iVar11 = (int)uVar9 + 0x10;
      while( true ) {
        if ((int)uVar6 <= iVar11) {
          if ((int)uVar9 < (int)uVar6) goto LAB_0010a0bf;
          goto LAB_0010a0df;
        }
        uVar12 = (uVar6 - 1) + (int)uVar9;
        uVar18 = uVar12 >> 1;
        uVar2 = *(ushort *)((long)&prVar3->value + (ulong)(uVar12 & 0xfffffffe));
        if (uVar21 <= uVar2) break;
        uVar9 = (ulong)(uVar18 + 1);
        iVar11 = uVar18 + 0x11;
      }
      uVar6 = uVar18;
      bVar22 = true;
    } while (uVar21 < uVar2);
  }
  else {
    bVar22 = (*(ulong *)(prVar3 + (uVar14 >> 6 & 0x3ffffff) * 2) >> (uVar14 & 0x3f) & 1) != 0;
  }
  goto LAB_0010a0e6;
  while( true ) {
    bVar22 = false;
    if ((uVar21 < (&prVar3->value)[uVar9]) ||
       (iVar11 = (int)uVar9, uVar9 = uVar9 + 1, bVar22 = false, uVar6 - 1 == iVar11)) break;
LAB_0010a0bf:
    if ((&prVar3->value)[uVar9] == uVar21) goto LAB_0010a0e3;
  }
LAB_0010a0e6:
  bVar1 = abStack_10038[uVar14];
  if ((bool)bVar1 != bVar22) {
    printf("problem at index %d should be (but isnt) %d\n",uVar14 & 0xffffffff,(ulong)(uint)bVar1);
  }
  prVar7 = prStack_10078;
  uVar6 = uVar13;
  if (type == '\x04') {
    prVar7 = *(run_container_t **)prStack_10078;
    uVar6 = (uint)*(byte *)&prStack_10078->runs;
  }
  prVar3 = prVar7->runs;
  if ((char)uVar6 == '\x03') {
    if (0 < prVar7->n_runs) {
      iVar11 = prVar7->n_runs + -1;
      uVar6 = 0;
      do {
        uVar12 = iVar11 + uVar6 >> 1;
        if (prVar3[uVar12].value < uVar21) {
          uVar6 = uVar12 + 1;
        }
        else {
          if (prVar3[uVar12].value <= uVar21) goto LAB_0010a1f6;
          iVar11 = uVar12 - 1;
        }
      } while ((int)uVar6 <= iVar11);
      if ((uVar6 != 0) &&
         (a = 1, (int)((int)uVar14 - (uint)prVar3[(ulong)uVar6 - 1].value) <=
                 (int)(uint)prVar3[(ulong)uVar6 - 1].length)) goto LAB_0010a1fb;
    }
LAB_0010a1f2:
    a = 0;
  }
  else if ((uVar6 & 0xff) == 2) {
    uVar6 = 0;
    uVar12 = prVar7->n_runs;
    do {
      iVar11 = uVar6 + 0x10;
      while( true ) {
        if ((int)uVar12 <= iVar11) {
          if ((int)uVar12 <= (int)uVar6) goto LAB_0010a1f2;
          uVar9 = (ulong)uVar6;
          goto LAB_0010a1d4;
        }
        uVar18 = (uVar12 - 1) + uVar6;
        uVar15 = uVar18 >> 1;
        uVar2 = *(ushort *)((long)&prVar3->value + (ulong)(uVar18 & 0xfffffffe));
        if (uVar21 <= uVar2) break;
        uVar6 = uVar15 + 1;
        iVar11 = uVar15 + 0x11;
      }
      a = 1;
      uVar12 = uVar15;
    } while (uVar21 < uVar2);
  }
  else {
    a = (unsigned_long)
        ((*(ulong *)(prVar3 + (uVar14 >> 6 & 0x3ffffff) * 2) >> (uVar14 & 0x3f) & 1) != 0);
  }
LAB_0010a1fb:
  _assert_int_equal(a,(ulong)(uint)bVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x6ab);
  uVar14 = uVar14 + 1;
  if (uVar14 == 0x10000) goto code_r0x0010a21f;
  goto LAB_00109fee;
LAB_0010a0e3:
  bVar22 = true;
  goto LAB_0010a0e6;
  while( true ) {
    if (uVar21 <= uVar2 && uVar2 != uVar21) goto LAB_0010a1f2;
    a = 0;
    iVar11 = (int)uVar9;
    uVar9 = uVar9 + 1;
    if (uVar12 - 1 == iVar11) break;
LAB_0010a1d4:
    uVar2 = (&prVar3->value)[uVar9];
    if (uVar2 == uVar21) goto LAB_0010a1f6;
  }
  goto LAB_0010a1fb;
LAB_0010a1f6:
  a = 1;
  goto LAB_0010a1fb;
code_r0x0010a21f:
  container_free(prStack_10078,type);
  uVar9 = uStack_10040;
  if ((char)uStack_1006c == '\0') {
    run_container_free(src);
  }
  uVar14 = uVar9 * 3 + 1 & 0xffffffff;
  uVar13 = (int)uVar9 * 3 + iVar5 + 1;
  uVar9 = (ulong)uVar13;
  if (0xffff < (int)uVar13) goto code_r0x0010a264;
  goto LAB_00109e4c;
code_r0x0010a264:
  bVar22 = 0xd8e1 < uVar10;
  uVar10 = uVar10 + 0x271d;
  if (bVar22) goto code_r0x0010a27b;
  goto LAB_00109e46;
code_r0x0010a27b:
  uVar13 = (uint)((double)(int)uStack_10050 * 2.7 + 1.0);
  uVar14 = (ulong)uVar13;
  if (999 < (int)uVar13) goto code_r0x0010a2a3;
  goto LAB_00109e17;
code_r0x0010a2a3:
  uVar20 = (uint)((double)(int)uVar20 * 1.5 + 1.0);
  if (99 < (int)uVar20) goto code_r0x0010a2cf;
  goto LAB_00109de6;
code_r0x0010a2cf:
  uVar20 = (uint)uStack_10068 * 3;
  uVar10 = (ulong)uVar20;
  if (0x21 < (uint)uStack_10068) {
    return uVar20;
  }
  goto LAB_00109dc4;
}

Assistant:

static int run_many_negation_range_tests_simpler(bool inplace) {
    for (int h = 1; h < 100; h *= 3) {
        printf("h=%d\n", h);
        for (int k = h + 1; k < 100; k = k * 1.5 + 1) {
            printf("  k=%d\n", k);
            for (int start_offset = 0; start_offset < 1000;
                 start_offset = start_offset * 2.7 + 1) {
                for (int r_start = 0; r_start < 65535; r_start += 10013)
                    for (int span = 0; r_start + span < 65536;
                         span = span * 3 + 1) {
                        run_negation_range_tests_simpler(
                            k, h, start_offset, r_start, r_start + span,
                            inplace);
                    }
            }
        }
    }
    return 1;
}